

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O2

int __thiscall MemoryMappedFile::open(MemoryMappedFile *this,char *__file,int __oflag,...)

{
  Log *pLVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  undefined8 uVar5;
  int in_ECX;
  stat *string;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __ino_t *this_01;
  Log local_1a0;
  Log local_190;
  char local_180 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  undefined1 local_150 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  Log local_130;
  Log local_120;
  Log local_110;
  Log local_100;
  Log local_f0;
  Log local_e0;
  Log local_d0;
  stat st;
  
  if (this->mAccessType != NO_ACCESS) {
    close(this,(int)__file);
  }
  if (__oflag == 0) {
    error();
    Log::operator<<(&local_d0,(char *)&st);
    this_00 = &local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
LAB_0018ac0f:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  }
  else {
    iVar2 = ::open(*(char **)__file,(uint)(__oflag != 1) * 2);
    this->mFd = iVar2;
    if (iVar2 == -1) {
      error();
      Log::operator<<((Log *)(local_150 + 0x10),(char *)&local_1a0);
      operator<<((Log *)&st,(String *)(local_150 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      piVar3 = __errno_location();
      if (*piVar3 == 2) {
        Log::operator<<(&local_e0,(char *)&st);
        this_00 = &local_e0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
      else {
        Log::operator<<(&local_1a0,(char *)&st);
        Log::addStringStream<int>(&local_f0,(int)&local_1a0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_f0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_00 = &local_1a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
      goto LAB_0018ac0f;
    }
    if (in_ECX != 0) {
LAB_0018ac29:
      iVar2 = fstat(iVar2,(stat *)&st);
      if (iVar2 != 0) {
        error();
        Log::operator<<((Log *)(local_170 + 0x10),local_180);
        operator<<(&local_190,(String *)(local_170 + 0x10));
        Log::operator<<(&local_1a0,(char *)&local_190);
        __errno_location();
        iVar2 = (int)&local_1a0;
        Log::addStringStream<int>(&local_120,iVar2);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_120.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_190.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178);
        close(this,iVar2);
        return 0;
      }
      this->mFileSize = st.st_size;
      if (st.st_size == 0) {
        uVar5 = std::__cxx11::string::_M_assign((string *)&this->mFilename);
        this->mAccessType = __oflag;
        this->mpMapped = (void *)0x0;
LAB_0018ad4a:
        return (int)CONCAT71((int7)((ulong)uVar5 >> 8),1);
      }
      pvVar4 = mmap((void *)0x0,st.st_size,(uint)(__oflag != 1) * 2 + 1,1,this->mFd,0);
      this->mpMapped = pvVar4;
      if (pvVar4 != (void *)0xffffffffffffffff) {
        uVar5 = std::__cxx11::string::_M_assign((string *)&this->mFilename);
        this->mAccessType = __oflag;
        goto LAB_0018ad4a;
      }
      this->mpMapped = (void *)0x0;
      close(this,(int)st.st_size);
      error();
      Log::operator<<((Log *)local_170,local_180);
      operator<<(&local_190,(String *)local_170);
      Log::operator<<(&local_1a0,(char *)&local_190);
      __errno_location();
      Log::addStringStream<int>(&local_130,(int)&local_1a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_130.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_190.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 8));
      this_01 = (__ino_t *)&local_178;
      goto LAB_0018ac1c;
    }
    do {
      iVar2 = flock(this->mFd,6);
      if (iVar2 != -1) {
        iVar2 = this->mFd;
        goto LAB_0018ac29;
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    error();
    Log::operator<<((Log *)local_150,(char *)&local_1a0);
    operator<<((Log *)&st,(String *)local_150);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (*piVar3 == 0xb) {
      string = &st;
      Log::operator<<(&local_100,(char *)string);
      iVar2 = (int)string;
      pLVar1 = &local_100;
    }
    else {
      Log::operator<<(&local_1a0,(char *)&st);
      iVar2 = (int)&local_1a0;
      Log::addStringStream<int>(&local_110,iVar2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_110.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pLVar1 = &local_1a0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(pLVar1->mData).super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    close(this,iVar2);
  }
  this_01 = &st.st_ino;
LAB_0018ac1c:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
  return 0;
}

Assistant:

bool MemoryMappedFile::open(const Path &f_filename, AccessType f_access,
                            LockType f_lock)
{
    if(isOpen()) close();

    if(f_access == NO_ACCESS)
    {
        error() << "Can't create MemoryMappedFile with access type NO_ACCESS";
        return false;
    }

#ifdef _WIN32

    const DWORD access = (f_access == READ_ONLY) ?
        GENERIC_READ : (GENERIC_READ | GENERIC_WRITE);
    const DWORD share = (f_lock == DO_LOCK) ?
        0 : (FILE_SHARE_READ | FILE_SHARE_WRITE);
    const DWORD protect = (f_access == READ_ONLY) ?
        PAGE_READONLY : PAGE_READWRITE;
    const DWORD desiredAccess = (f_access == READ_ONLY) ?
        FILE_MAP_READ : FILE_MAP_WRITE; // FILE_MAP_WRITE includes read access

    // first, we need to open the file:
    mhFile = CreateFileW(Utf8To16(f_filename.nullTerminated()),
                         access,
                         share,
                         NULL,
                         OPEN_EXISTING,
                         FILE_ATTRIBUTE_NORMAL,
                         NULL);

    if(mhFile == INVALID_HANDLE_VALUE)
    {
        const DWORD errorCode = GetLastError();

        auto errStream = error() << "Can't open file " << f_filename;
        switch(errorCode)
        {
        case ERROR_FILE_NOT_FOUND:
            errStream << " (file not found)";
            break;
        case ERROR_SHARING_VIOLATION:
            errStream << " (file is locked)";
            break;
        default:
            errStream << "GetLastError(): " << errorCode;
        }

        return false;
    }

    mFileSize = GetFileSize(mhFile, NULL);

    if(mFileSize == 0)
    {
        // can't map empty file. We still report it as success (with size() == 0)
        mFilename = f_filename;
        mAccessType = f_access;
        mpMapped = nullptr;
        return true;
    }

    // now, we can set up a file mapping:
    mhFileMapping = CreateFileMapping(mhFile,   // file to map
                                      NULL,     // security attrs
                                      protect,
                                      0, 0,     // use full file size
                                      NULL);    // name

    if(mhFileMapping == NULL)
    {
        error() << "Can't map file " << f_filename << ". "
                << "GetLastError(): " << GetLastError();
        close();
        return false;
    }

    // now we need to open a so-called "view" into the file mapping:
    mpMapped = MapViewOfFile(mhFileMapping, desiredAccess,
                             0,0,  // offset high and low
                             0);   // size


    if(mpMapped == NULL)
    {
        error() << "Can't map view of file " << f_filename << ". "
                << "GetLastError(): " << GetLastError();
        close();
        return false;
    }

#else
    // try to open the file
    const int openFlags = (f_access == READ_ONLY) ?
        O_RDONLY : O_RDWR;
    const int protFlags = (f_access == READ_ONLY) ?
        PROT_READ : (PROT_READ | PROT_WRITE);

    mFd = ::open(f_filename.nullTerminated(), openFlags);

    if(mFd == -1)
    {
        auto errStream = error() << "Could not open file " << f_filename;
        switch(errno)
        {
        case ENOENT:
            errStream << " (file does not exist)";
            break;
        default:
            errStream << ". errno=" << errno;
            break;
        }
        return false;
    }

    if(f_lock == DO_LOCK)
    {
        int lockRes;
        eintrwrap(lockRes, flock(mFd, LOCK_EX | LOCK_NB));

        if(lockRes == -1)
        {
            auto errStream = error() << "Could not lock file " << f_filename;
            switch(errno)
            {
            case EWOULDBLOCK:
                errStream << " (file is already locked)";
                break;
            default:
                errStream << ". errno=" << errno;
                break;
            }
            close();
            return false;
        }
    }

    // get file size
    struct stat st;
    if(fstat(mFd, &st) != 0)
    {
        error() << "Could not stat file " << f_filename
                << ". errno=" << errno;
        close();
        return false;
    }

    mFileSize = st.st_size;   // size in byte

    if(mFileSize == 0)
    {
        // can't map empty file. We still report it as success (with size() == 0)
        mFilename = f_filename;
        mAccessType = f_access;
        mpMapped = nullptr;
        return true;
    }

    // now, we can actually map the file
    mpMapped = mmap(
            NULL,       // destination hint
            mFileSize,
            protFlags,  // mmu page protection
            MAP_SHARED,
            mFd,
            0           // offset
        );

    if(mpMapped == MAP_FAILED)
    {
        mpMapped = nullptr;
        close();
        error() << "Could not map file " << f_filename
                << ". errno=" << errno;
        return false;
    }

#endif

    // everything worked out! We're done.
    mFilename = f_filename;
    mAccessType = f_access;
    return true;
}